

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModeXCodeRecord.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::ModeXCodeRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ModeXCodeRecord *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  ModeXCodeRecord *local_18;
  ModeXCodeRecord *this_local;
  
  local_18 = this;
  this_local = (ModeXCodeRecord *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"On/Off Status:       ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((byte)((this->m_CodeUnion).m_ui16Code >> 0xd) & 1));
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Damage Status:       ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((byte)((this->m_CodeUnion).m_ui16Code >> 0xe) & 1));
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Malfunction Status:  ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,SUB21((this->m_CodeUnion).m_ui16Code >> 0xf,0));
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString ModeXCodeRecord::GetAsString() const
{
    KStringStream ss;

	ss << "On/Off Status:       " << ( KBOOL )m_CodeUnion.m_ui16OnOff << "\n"
	   << "Damage Status:       " << ( KBOOL )m_CodeUnion.m_ui16Dmg   << "\n"
	   << "Malfunction Status:  " << ( KBOOL )m_CodeUnion.m_ui16MalFnc << "\n";

    return ss.str();
}